

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_decompress.c
# Opt level: O3

size_t ZSTD_findFrameCompressedSize(void *src,size_t srcSize)

{
  size_t sVar1;
  ulong uVar2;
  BYTE *ipstart;
  ulong srcSize_00;
  void *src_00;
  bool bVar3;
  blockProperties_t blockProperties;
  ZSTD_frameHeader zfh;
  blockProperties_t local_54;
  ZSTD_frameHeader local_48;
  
  if ((srcSize < 8) || ((*src & 0xfffffff0) != 0x184d2a50)) {
    sVar1 = ZSTD_getFrameHeader_advanced(&local_48,src,srcSize,ZSTD_f_zstd1);
    if ((sVar1 < 0xffffffffffffff89) && (bVar3 = sVar1 == 0, sVar1 = 0xffffffffffffffb8, bVar3)) {
      src_00 = (void *)((long)src + (ulong)local_48.headerSize);
      srcSize_00 = srcSize - local_48.headerSize;
      sVar1 = ZSTD_getcBlockSize(src_00,srcSize_00,&local_54);
      if (sVar1 < 0xffffffffffffff89) {
        do {
          uVar2 = sVar1 + 3;
          bVar3 = srcSize_00 < uVar2;
          srcSize_00 = srcSize_00 - uVar2;
          if (bVar3) {
            return 0xffffffffffffffb8;
          }
          src_00 = (void *)((long)src_00 + uVar2);
          if (local_54.lastBlock != 0) {
            if (local_48.checksumFlag != 0) {
              if (srcSize_00 < 4) {
                return 0xffffffffffffffb8;
              }
              src_00 = (void *)((long)src_00 + 4);
            }
            return (long)src_00 - (long)src;
          }
          sVar1 = ZSTD_getcBlockSize(src_00,srcSize_00,&local_54);
        } while (sVar1 < 0xffffffffffffff89);
      }
    }
  }
  else {
    sVar1 = 0xfffffffffffffff2;
    if (*(uint *)((long)src + 4) >> 3 < 0x1fffffff) {
      sVar1 = (ulong)*(uint *)((long)src + 4) + 8;
    }
  }
  return sVar1;
}

Assistant:

size_t ZSTD_findFrameCompressedSize(const void *src, size_t srcSize)
{
#if defined(ZSTD_LEGACY_SUPPORT) && (ZSTD_LEGACY_SUPPORT >= 1)
    if (ZSTD_isLegacy(src, srcSize))
        return ZSTD_findFrameCompressedSizeLegacy(src, srcSize);
#endif
    if ( (srcSize >= ZSTD_SKIPPABLEHEADERSIZE)
      && (MEM_readLE32(src) & ZSTD_MAGIC_SKIPPABLE_MASK) == ZSTD_MAGIC_SKIPPABLE_START ) {
        return readSkippableFrameSize(src, srcSize);
    } else {
        const BYTE* ip = (const BYTE*)src;
        const BYTE* const ipstart = ip;
        size_t remainingSize = srcSize;
        ZSTD_frameHeader zfh;

        /* Extract Frame Header */
        {   size_t const ret = ZSTD_getFrameHeader(&zfh, src, srcSize);
            if (ZSTD_isError(ret)) return ret;
            if (ret > 0) return ERROR(srcSize_wrong);
        }

        ip += zfh.headerSize;
        remainingSize -= zfh.headerSize;

        /* Loop on each block */
        while (1) {
            blockProperties_t blockProperties;
            size_t const cBlockSize = ZSTD_getcBlockSize(ip, remainingSize, &blockProperties);
            if (ZSTD_isError(cBlockSize)) return cBlockSize;

            if (ZSTD_blockHeaderSize + cBlockSize > remainingSize)
                return ERROR(srcSize_wrong);

            ip += ZSTD_blockHeaderSize + cBlockSize;
            remainingSize -= ZSTD_blockHeaderSize + cBlockSize;

            if (blockProperties.lastBlock) break;
        }

        if (zfh.checksumFlag) {   /* Final frame content checksum */
            if (remainingSize < 4) return ERROR(srcSize_wrong);
            ip += 4;
        }

        return ip - ipstart;
    }
}